

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

int CNetBan::CNetHash::MakeHashArray(NETADDR_conflict *pAddr,CNetHash *aHash)

{
  int iVar1;
  int Sum;
  int i;
  int Length;
  CNetHash *aHash_local;
  NETADDR_conflict *pAddr_local;
  
  iVar1 = 0x10;
  if (pAddr->type == 1) {
    iVar1 = 4;
  }
  aHash->m_Hash = 0;
  aHash->m_HashIndex = 0;
  Sum = 0;
  for (i = 1; i <= iVar1; i = i + 1) {
    Sum = (uint)pAddr->ip[i + -1] + Sum;
    aHash[i].m_Hash = Sum & 0xff;
    aHash[i].m_HashIndex = i % iVar1;
  }
  return iVar1;
}

Assistant:

int CNetBan::CNetHash::MakeHashArray(const NETADDR *pAddr, CNetHash aHash[17])
{
	int Length = pAddr->type==NETTYPE_IPV4 ? 4 : 16;
	aHash[0].m_Hash = 0;
	aHash[0].m_HashIndex = 0;
	for(int i = 1, Sum = 0; i <= Length; ++i)
	{
		Sum += pAddr->ip[i-1];
		aHash[i].m_Hash = Sum&0xFF;
		aHash[i].m_HashIndex = i%Length;
	}
	return Length;
}